

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

XMLAttribute * __thiscall tinyxml2::XMLElement::FindOrCreateAttribute(XMLElement *this,char *name)

{
  bool bVar1;
  char *p;
  XMLAttribute *local_28;
  XMLAttribute *attrib;
  XMLAttribute *last;
  char *name_local;
  XMLElement *this_local;
  
  attrib = (XMLAttribute *)0x0;
  for (local_28 = this->_rootAttribute; local_28 != (XMLAttribute *)0x0; local_28 = local_28->_next)
  {
    p = XMLAttribute::Name(local_28);
    bVar1 = XMLUtil::StringEqual(p,name,0x7fffffff);
    if (bVar1) break;
    attrib = local_28;
  }
  if (local_28 == (XMLAttribute *)0x0) {
    local_28 = CreateAttribute(this);
    if (attrib == (XMLAttribute *)0x0) {
      this->_rootAttribute = local_28;
    }
    else {
      attrib->_next = local_28;
    }
    XMLAttribute::SetName(local_28,name);
  }
  return local_28;
}

Assistant:

XMLAttribute* XMLElement::FindOrCreateAttribute( const char* name )
{
    XMLAttribute* last = 0;
    XMLAttribute* attrib = 0;
    for( attrib = _rootAttribute;
            attrib;
            last = attrib, attrib = attrib->_next ) {
        if ( XMLUtil::StringEqual( attrib->Name(), name ) ) {
            break;
        }
    }
    if ( !attrib ) {
        attrib = CreateAttribute();
        TIXMLASSERT( attrib );
        if ( last ) {
            TIXMLASSERT( last->_next == 0 );
            last->_next = attrib;
        }
        else {
            TIXMLASSERT( _rootAttribute == 0 );
            _rootAttribute = attrib;
        }
        attrib->SetName( name );
    }
    return attrib;
}